

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O3

void eltcalc::OutputQuantiles
               (summarySampleslevelHeader *sh,vector<float,_std::allocator<float>_> *losses_vec,
               FILE *outFile)

{
  pointer pfVar1;
  pointer pfVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  _Rb_tree_node_base *p_Var6;
  float fVar7;
  char buffer [4096];
  char acStack_1038 [4104];
  
  pfVar1 = (losses_vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (losses_vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pfVar1 != pfVar2) {
    uVar5 = (long)pfVar2 - (long)pfVar1 >> 2;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar1,pfVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar1,pfVar2);
  }
  p_Var6 = (_Rb_tree_node_base *)intervals_._24_8_;
  if (intervals_._24_8_ != 0x109268) {
    do {
      iVar4 = *(int *)&p_Var6[1].field_0x4;
      pfVar1 = (losses_vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (iVar4 == (int)((ulong)((long)(losses_vec->
                                       super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pfVar1) >> 2)) {
        fVar7 = pfVar1[(long)iVar4 + -1];
      }
      else {
        fVar7 = (pfVar1[iVar4] - pfVar1[(long)iVar4 + -1]) * *(float *)&p_Var6[1]._M_parent +
                pfVar1[(long)iVar4 + -1];
      }
      iVar4 = sprintf(acStack_1038,"%d,%d,%f,%f\n",(double)(float)p_Var6[1]._M_color,(double)fVar7,
                      (ulong)(uint)sh->event_id,(ulong)(uint)sh->summary_id);
      WriteOutput(acStack_1038,iVar4,outFile);
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != (_Rb_tree_node_base *)(intervals_ + 8));
  }
  return;
}

Assistant:

void OutputQuantiles(const summarySampleslevelHeader& sh,
			     std::vector<OASIS_FLOAT>& losses_vec,
			     FILE * outFile)
	{

		std::sort(losses_vec.begin(), losses_vec.end());

		for (std::map<float, interval>::iterator it = intervals_.begin();
		     it != intervals_.end(); ++it) {

			OASIS_FLOAT loss = GetQuantileLoss(it->second, losses_vec);
			OutputQuantilesCsv(outFile, sh, it->first, loss);

		}

	}